

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trait.cpp
# Opt level: O2

Point * MeshLib::Trait::getUV(Point *__return_storage_ptr__,string *s)

{
  double py;
  string subs;
  char line [1024];
  
  std::__cxx11::string::find((char *)s,0x1158a9);
  std::__cxx11::string::substr((ulong)&subs,(ulong)s);
  __isoc99_sscanf(subs._M_dataplus._M_p,"uv=(%lf %lf)%s",__return_storage_ptr__,&py,line);
  __return_storage_ptr__->v[1] = py;
  __return_storage_ptr__->v[2] = 0.0;
  std::__cxx11::string::~string((string *)&subs);
  return __return_storage_ptr__;
}

Assistant:

Point Trait::getUV(std::string s)
{
	std::string::size_type pos = s.find ("uv=");
	std::string subs = s.substr (pos);
	double px, py;
	char line[1024];
	sscanf(subs.c_str (),"uv=(%lf %lf)%s",&px,&py,line);
	return Point(px,py,0);
}